

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O2

int dynamic_valid(menu_conflict *m,int oid)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = m->menu_data;
  iVar2 = oid + 1;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      return *(int *)((long)pvVar1 + 0xc);
    }
    pvVar1 = *(void **)((long)pvVar1 + 0x10);
  } while (pvVar1 != (void *)0x0);
  __assert_fail("entry",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-menu.c"
                ,0x3f9,"int dynamic_valid(struct menu *, int)");
}

Assistant:

static int dynamic_valid(struct menu *m, int oid)
{
	struct menu_entry *entry;

	for (entry = menu_priv(m); oid; oid--) {
		entry = entry->next;
		assert(entry);
	}

	return entry->valid;
}